

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * __thiscall IR::Instr::GetInsertBeforeByteCodeUsesInstr(Instr *this)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  bool bVar4;
  Instr *local_28;
  Instr *prevInstr;
  Instr *insertBeforeInstr;
  uint32 byteCodeOffset;
  Instr *this_local;
  
  uVar2 = GetByteCodeOffset(this);
  local_28 = this->m_prev;
  prevInstr = this;
  while( true ) {
    bVar4 = false;
    if (local_28 != (Instr *)0x0) {
      bVar1 = IsByteCodeUsesInstr(local_28);
      bVar4 = false;
      if (bVar1) {
        uVar3 = GetByteCodeOffset(local_28);
        bVar4 = uVar3 == uVar2;
      }
    }
    if (!bVar4) break;
    prevInstr = local_28;
    local_28 = local_28->m_prev;
  }
  return prevInstr;
}

Assistant:

IR::Instr *Instr::GetInsertBeforeByteCodeUsesInstr()
{
    const uint32 byteCodeOffset = GetByteCodeOffset();
    IR::Instr *insertBeforeInstr = this;
    IR::Instr *prevInstr = insertBeforeInstr->m_prev;
    while(prevInstr && prevInstr->IsByteCodeUsesInstr() && prevInstr->GetByteCodeOffset() == byteCodeOffset)
    {
        insertBeforeInstr = prevInstr;
        prevInstr = prevInstr->m_prev;
    }
    return insertBeforeInstr;
}